

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void S_ChannelEnded(FISoundChannel *ichan)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  
  if (ichan != (FISoundChannel *)0x0) {
    fVar1 = ichan[1].DistanceScale;
    if (((uint)fVar1 & 4) != 0) goto LAB_00322d31;
    if (((uint)fVar1 & 0x102) == 0) {
      uVar2 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,ichan);
      uVar3 = (*GSnd->_vptr_SoundRenderer[9])
                        (GSnd,S_sfx.Array[ichan[1].Rolloff.RolloffType].data.data);
      if (uVar2 == 0) {
        fVar1 = ichan[1].DistanceScale;
        if (((uint)fVar1 >> 9 & 1) == 0) goto LAB_00322d31;
      }
      else {
        if (uVar3 <= uVar2) {
LAB_00322d31:
          S_ReturnChannel((FSoundChan *)ichan);
          return;
        }
        fVar1 = ichan[1].DistanceScale;
      }
    }
    ichan[1].DistanceScale = (float)((uint)fVar1 | 2);
    ichan->SysChannel = (void *)0x0;
  }
  return;
}

Assistant:

void S_ChannelEnded(FISoundChannel *ichan)
{
	FSoundChan *schan = static_cast<FSoundChan*>(ichan);
	bool evicted;

	if (schan != NULL)
	{
		// If the sound was stopped with GSnd->StopSound(), then we know
		// it wasn't evicted. Otherwise, if it's looping, it must have
		// been evicted. If it's not looping, then it was evicted if it
		// didn't reach the end of its playback.
		if (schan->ChanFlags & CHAN_FORGETTABLE)
		{
			evicted = false;
		}
		else if (schan->ChanFlags & (CHAN_LOOP | CHAN_EVICTED))
		{
			evicted = true;
		}
		else
		{ 
			unsigned int pos = GSnd->GetPosition(schan);
			unsigned int len = GSnd->GetSampleLength(S_sfx[schan->SoundID].data);
			if (pos == 0)
			{
				evicted = !!(schan->ChanFlags & CHAN_JUSTSTARTED);
			}
			else
			{
				evicted = (pos < len);
			}
		}
		if (!evicted)
		{
			S_ReturnChannel(schan);
		}
		else
		{
			schan->ChanFlags |= CHAN_EVICTED;
			schan->SysChannel = NULL;
		}
	}
}